

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf64.c
# Opt level: O3

void elf64_symbols(GlobalVars *gv,Elf64_Ehdr *ehdr,ObjectUnit *ou,Elf64_Shdr *shdr)

{
  byte bVar1;
  LinkFile *lf;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint16_t uVar5;
  uint32_t uVar6;
  uint32_t shtype;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  char *pcVar10;
  uint uVar11;
  uchar *p;
  uint8_t *symname;
  bool bVar12;
  ulong local_80;
  
  bVar12 = ehdr->e_ident[5] == '\x02';
  lf = ou->lnkfile;
  uVar11 = (uint)bVar12;
  uVar7 = read64(uVar11,shdr->sh_offset);
  uVar8 = read64(uVar11,shdr->sh_entsize);
  uVar9 = read64(uVar11,shdr->sh_size);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar8;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar9;
  local_80 = SUB168(auVar4 / auVar3,0);
  uVar6 = read32(uVar11,shdr->sh_link);
  pcVar10 = elf64_strtab(lf,ehdr,uVar6);
  uVar9 = read64(uVar11,shdr->sh_size);
  elf_check_offset(lf,"symbol",ehdr->e_ident + uVar7,uVar9);
  if (1 < SUB164(auVar4 / auVar3,0)) {
    p = ehdr->e_type + uVar7 + uVar8;
    do {
      uVar11 = (uint)bVar12;
      uVar6 = read32(uVar11,(Elf64_Ehdr *)(p + -0x10));
      symname = (uint8_t *)(pcVar10 + uVar6);
      if ((symname < lf->data) || (lf->data + lf->length < symname)) {
        pcVar2 = lf->pathname;
        uVar6 = read32(uVar11,(Elf64_Ehdr *)(p + -0x10));
        error(0x7f,pcVar2,(ulong)uVar6,lf->objname);
      }
      uVar6 = read32(uVar11,shdr->sh_type);
      uVar5 = read16(uVar11,p + -10);
      shtype = read32(uVar11,shdr->sh_type);
      bVar1 = p[-0xc];
      uVar7 = read64(uVar11,p + -8);
      uVar9 = read64(uVar11,p);
      elf_add_symbol(gv,ou,(char *)symname,(uVar6 == 0xb) << 4,(uint)uVar5,shtype,bVar1 & 0xf,
                     bVar1 >> 4,uVar7,(uint32_t)uVar9);
      p = p + uVar8;
      uVar11 = (uint)local_80;
      local_80 = (ulong)(uVar11 - 1);
    } while (2 < uVar11);
  }
  return;
}

Assistant:

static void elf64_symbols(struct GlobalVars *gv,struct Elf64_Ehdr *ehdr,
                   struct ObjectUnit *ou,struct Elf64_Shdr *shdr)
/* convert ELF symbol definitions into internal format */
{
  bool be = (ehdr->e_ident[EI_DATA] == ELFDATA2MSB);
  struct LinkFile *lf = ou->lnkfile;
  uint8_t *data = (uint8_t *)ehdr + read64(be,shdr->sh_offset);
  unsigned long entsize = read64(be,shdr->sh_entsize);
  int nsyms = (int)(read64(be,shdr->sh_size) / (uint64_t)entsize);
  char *strtab = elf64_strtab(lf,ehdr,read32(be,shdr->sh_link));

  elf_check_offset(lf,"symbol",data,read64(be,shdr->sh_size));

  /* read ELF xdef symbols and convert to internal format */
  while (--nsyms > 0) {
    struct Elf64_Sym *elfsym;
    char *symname;

    elfsym = (struct Elf64_Sym *)(data += entsize);
    symname = strtab + read32(be,elfsym->st_name);
    if (symname<(char *)lf->data || symname>(char *)lf->data+lf->length)
      error(127,lf->pathname,read32(be,elfsym->st_name),lf->objname);

    elf_add_symbol(gv,ou,symname,
                   (read32(be,shdr->sh_type)==SHT_DYNSYM) ? SYMF_SHLIB : 0,
                   read16(be,elfsym->st_shndx),
                   read32(be,shdr->sh_type),
                   ELF64_ST_TYPE(*elfsym->st_info),
                   ELF64_ST_BIND(*elfsym->st_info),
                   read64(be,elfsym->st_value),
                   read64(be,elfsym->st_size));
  }
}